

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_optimization.cc
# Opt level: O1

void __thiscall
QPDF::pushInheritedAttributesToPageInternal
          (QPDF *this,QPDFObjectHandle *cur_pages,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>_>
          *key_ancestors,bool allow_changes,bool warn_skipped_keys)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__v;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var2;
  pointer pQVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *this_01;
  size_type sVar4;
  bool bVar5;
  int iVar6;
  element_type *peVar7;
  QPDFObjGen og;
  long *plVar8;
  reference this_02;
  _Rb_tree_node_base *p_Var9;
  mapped_type *pmVar10;
  _Base_ptr p_Var11;
  QPDFExc *this_03;
  string *filename;
  qpdf_offset_t offset;
  long *plVar12;
  iterator __begin2;
  string *key;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>_>
  pVar13;
  QPDFObjectHandle oh;
  iterator __begin1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  inheritable_keys;
  iterator local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined1 local_100 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f0;
  element_type *local_e8;
  QPDFObjectHandle local_d0;
  QPDFArrayItems local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  string local_a0;
  string local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  QPDFObjectHandle::getKeys_abi_cxx11_
            ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_100,cur_pages);
  if (local_e8 != (element_type *)(local_100 + 8)) {
    peVar7 = local_e8;
    do {
      __v = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)&(peVar7->value).
                    super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    .
                    super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    .
                    super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    .
                    super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    .
                    super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    .
                    super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
            + 0x20);
      iVar6 = std::__cxx11::string::compare((char *)__v);
      if ((((iVar6 == 0) || (iVar6 = std::__cxx11::string::compare((char *)__v), iVar6 == 0)) ||
          (iVar6 = std::__cxx11::string::compare((char *)__v), iVar6 == 0)) ||
         (iVar6 = std::__cxx11::string::compare((char *)__v), iVar6 == 0)) {
        if (!allow_changes) {
          this_03 = (QPDFExc *)__cxa_allocate_exception(0x80);
          filename = (string *)
                     (**(code **)(**(long **)&(((this->m)._M_t.
                                                super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                                .super__Head_base<0UL,_QPDF::Members_*,_false>.
                                               _M_head_impl)->file).
                                              super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>
                                 + 0x18))();
          _Var2._M_head_impl =
               (this->m)._M_t.
               super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
               super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
               super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
          offset = InputSource::getLastOffset
                             (((_Var2._M_head_impl)->file).
                              super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          local_150._vptr_iterator =
               (_func_int **)
               &local_150.m.
                super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_150,
                     "optimize detected an inheritable attribute when called in no-change mode","");
          QPDFExc::QPDFExc(this_03,qpdf_e_internal,filename,
                           &(_Var2._M_head_impl)->last_object_description,offset,
                           (string *)&local_150);
          __cxa_throw(this_03,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
        }
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&local_60,__v);
        QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_150,(string *)cur_pages);
        QPDFObjectHandle::isIndirect((QPDFObjectHandle *)&local_150);
        bVar5 = QPDFObjectHandle::isIndirect((QPDFObjectHandle *)&local_150);
        if ((!bVar5) && (bVar5 = QPDFObjectHandle::isScalar((QPDFObjectHandle *)&local_150), !bVar5)
           ) {
          local_b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_150._vptr_iterator;
          local_a8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_150.m.
                     super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_150.m.
              super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_150.m.
               super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->item_number =
                   (local_150.m.
                    super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->item_number + 1;
              UNLOCK();
            }
            else {
              (local_150.m.
               super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->item_number =
                   (local_150.m.
                    super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->item_number + 1;
            }
          }
          makeIndirectObject((QPDF *)&local_128,(QPDFObjectHandle *)this);
          QPDFObjectHandle::replaceKey(cur_pages,__v,(QPDFObjectHandle *)&local_128);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_string_length);
          }
          if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
          }
          QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_128,(string *)cur_pages);
          sVar4 = local_128._M_string_length;
          local_150._vptr_iterator = (_func_int **)local_128._M_dataplus._M_p;
          this_01 = local_150.m.
                    super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          local_128._M_dataplus._M_p = (pointer)0x0;
          local_128._M_string_length = 0;
          local_150.m.
          super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)sVar4;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01 !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_string_length);
          }
        }
        pmVar10 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>_>
                  ::operator[](key_ancestors,__v);
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
                  (pmVar10,(value_type *)&local_150);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>_>
        ::operator[](key_ancestors,__v);
        QPDFObjectHandle::removeKey(cur_pages,__v);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_150.m.
            super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_150.m.
                     super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
        }
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)__v);
        if (((iVar6 != 0) && (iVar6 = std::__cxx11::string::compare((char *)__v), iVar6 != 0)) &&
           ((iVar6 = std::__cxx11::string::compare((char *)__v), iVar6 != 0 &&
            (iVar6 = std::__cxx11::string::compare((char *)__v), iVar6 != 0)))) {
          if (warn_skipped_keys) {
            local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"/Parent","");
            bVar5 = QPDFObjectHandle::hasKey(cur_pages,&local_80);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            bVar5 = false;
          }
          if (bVar5 != false) {
            local_150._vptr_iterator =
                 (_func_int **)
                 &local_150.m.
                  super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"Pages object","");
            og = QPDFObjectHandle::getObjGen(cur_pages);
            setLastObjectDescription(this,(string *)&local_150,og);
            if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_150._vptr_iterator !=
                &local_150.m.
                 super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount) {
              operator_delete(local_150._vptr_iterator,
                              (ulong)((long)&(local_150.m.
                                              super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
            }
            _Var2._M_head_impl =
                 (this->m)._M_t.
                 super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                 super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                 super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
            std::operator+(&local_128,"Unknown key ",__v);
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_128);
            p_Var1 = &local_150.m.
                      super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount;
            plVar12 = plVar8 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar12) {
              local_150.m.
              super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar12;
              local_150.ivalue.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)plVar8[3];
              local_150._vptr_iterator = (_func_int **)p_Var1;
            }
            else {
              local_150.m.
              super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar12;
              local_150._vptr_iterator = (_func_int **)*plVar8;
            }
            local_150.m.
            super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)plVar8[1];
            *plVar8 = (long)plVar12;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            warn(this,qpdf_e_pages,&(_Var2._M_head_impl)->last_object_description,0,
                 (string *)&local_150);
            if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_150._vptr_iterator != p_Var1) {
              operator_delete(local_150._vptr_iterator,
                              (ulong)((long)&(local_150.m.
                                              super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
      }
      peVar7 = (element_type *)std::_Rb_tree_increment((_Rb_tree_node_base *)peVar7);
    } while (peVar7 != (element_type *)(local_100 + 8));
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_100);
  local_100._0_8_ = &local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"/Kids","");
  QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_150,(string *)cur_pages);
  QPDFObjectHandle::aitems((QPDFObjectHandle *)&local_150);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_150.m.
      super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_150.m.
               super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_100._0_8_ != &local_f0) {
    operator_delete((void *)local_100._0_8_,
                    (ulong)((long)&(local_f0._M_pi)->_vptr__Sp_counted_base + 1));
  }
  QPDFObjectHandle::QPDFArrayItems::begin((iterator *)local_100,&local_c0);
  QPDFObjectHandle::QPDFArrayItems::end(&local_150,&local_c0);
  while (bVar5 = QPDFObjectHandle::QPDFArrayItems::iterator::operator==
                           ((iterator *)local_100,&local_150), !bVar5) {
    this_02 = QPDFObjectHandle::QPDFArrayItems::iterator::operator*((iterator *)local_100);
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"/Pages","");
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"");
    bVar5 = QPDFObjectHandle::isDictionaryOfType(this_02,&local_128,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if (bVar5) {
      local_d0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (this_02->super_BaseHandle).obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_d0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (this_02->super_BaseHandle).obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (local_d0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_d0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_d0.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_d0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_d0.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count + 1;
        }
      }
      pushInheritedAttributesToPageInternal
                (this,&local_d0,key_ancestors,allow_changes,warn_skipped_keys);
      if (local_d0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_d0.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
    }
    else {
      for (p_Var9 = (key_ancestors->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var9 != &(key_ancestors->_M_t)._M_impl.super__Rb_tree_header;
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
        bVar5 = QPDFObjectHandle::hasKey(this_02,(string *)(p_Var9 + 1));
        if (!bVar5) {
          QPDFObjectHandle::replaceKey
                    (this_02,(string *)(p_Var9 + 1),
                     (QPDFObjectHandle *)&p_Var9[2]._M_parent[-1]._M_left);
        }
      }
    }
    QPDFObjectHandle::QPDFArrayItems::iterator::operator++((iterator *)local_100);
  }
  QPDFObjectHandle::QPDFArrayItems::iterator::~iterator(&local_150);
  QPDFObjectHandle::QPDFArrayItems::iterator::~iterator((iterator *)local_100);
  if (local_c0.oh.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.oh.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  p_Var11 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_60._M_impl.super__Rb_tree_header &&
      local_60._M_impl.super__Rb_tree_header._M_node_count != 0) {
    do {
      p_Var9 = p_Var11 + 1;
      pmVar10 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>_>
                ::operator[](key_ancestors,(key_type *)p_Var9);
      pQVar3 = (pmVar10->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      (pmVar10->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl.
      super__Vector_impl_data._M_finish = pQVar3 + -1;
      this_00 = pQVar3[-1].super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      pmVar10 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>_>
                ::operator[](key_ancestors,(key_type *)p_Var9);
      if ((pmVar10->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl
          .super__Vector_impl_data._M_start ==
          (pmVar10->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>)._M_impl
          .super__Vector_impl_data._M_finish) {
        pVar13 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>_>
                 ::equal_range(&key_ancestors->_M_t,(key_type *)p_Var9);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>_>
        ::_M_erase_aux(&key_ancestors->_M_t,(_Base_ptr)pVar13.first._M_node,
                       (_Base_ptr)pVar13.second._M_node);
      }
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
    } while ((_Rb_tree_header *)p_Var11 != &local_60._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void
QPDF::pushInheritedAttributesToPageInternal(
    QPDFObjectHandle cur_pages,
    std::map<std::string, std::vector<QPDFObjectHandle>>& key_ancestors,
    bool allow_changes,
    bool warn_skipped_keys)
{
    // Make a list of inheritable keys. Only the keys /MediaBox, /CropBox, /Resources, and /Rotate
    // are inheritable attributes. Push this object onto the stack of pages nodes that have values
    // for this attribute.

    std::set<std::string> inheritable_keys;
    for (auto const& key: cur_pages.getKeys()) {
        if ((key == "/MediaBox") || (key == "/CropBox") || (key == "/Resources") ||
            (key == "/Rotate")) {
            if (!allow_changes) {
                throw QPDFExc(
                    qpdf_e_internal,
                    m->file->getName(),
                    m->last_object_description,
                    m->file->getLastOffset(),
                    "optimize detected an inheritable attribute when called in no-change mode");
            }

            // This is an inheritable resource
            inheritable_keys.insert(key);
            QPDFObjectHandle oh = cur_pages.getKey(key);
            QTC::TC("qpdf", "QPDF opt direct pages resource", oh.isIndirect() ? 0 : 1);
            if (!oh.isIndirect()) {
                if (!oh.isScalar()) {
                    // Replace shared direct object non-scalar resources with indirect objects to
                    // avoid copying large structures around.
                    cur_pages.replaceKey(key, makeIndirectObject(oh));
                    oh = cur_pages.getKey(key);
                } else {
                    // It's okay to copy scalars.
                    QTC::TC("qpdf", "QPDF opt inherited scalar");
                }
            }
            key_ancestors[key].push_back(oh);
            if (key_ancestors[key].size() > 1) {
                QTC::TC("qpdf", "QPDF opt key ancestors depth > 1");
            }
            // Remove this resource from this node.  It will be reattached at the page level.
            cur_pages.removeKey(key);
        } else if (!((key == "/Type") || (key == "/Parent") || (key == "/Kids") ||
                     (key == "/Count"))) {
            // Warn when flattening, but not if the key is at the top level (i.e. "/Parent" not
            // set), as we don't change these; but flattening removes intermediate /Pages nodes.
            if ((warn_skipped_keys) && (cur_pages.hasKey("/Parent"))) {
                QTC::TC("qpdf", "QPDF unknown key not inherited");
                setLastObjectDescription("Pages object", cur_pages.getObjGen());
                warn(
                    qpdf_e_pages,
                    m->last_object_description,
                    0,
                    ("Unknown key " + key +
                     " in /Pages object is being discarded as a result of flattening the /Pages "
                     "tree"));
            }
        }
    }

    // Process descendant nodes. This method does not perform loop detection because all code paths
    // that lead here follow a call to getAllPages, which already throws an exception in the event
    // of a loop in the pages tree.
    for (auto& kid: cur_pages.getKey("/Kids").aitems()) {
        if (kid.isDictionaryOfType("/Pages")) {
            pushInheritedAttributesToPageInternal(
                kid, key_ancestors, allow_changes, warn_skipped_keys);
        } else {
            // Add all available inheritable attributes not present in this object to this object.
            for (auto const& iter: key_ancestors) {
                std::string const& key = iter.first;
                if (!kid.hasKey(key)) {
                    QTC::TC("qpdf", "QPDF opt resource inherited");
                    kid.replaceKey(key, iter.second.back());
                } else {
                    QTC::TC("qpdf", "QPDF opt page resource hides ancestor");
                }
            }
        }
    }

    // For each inheritable key, pop the stack.  If the stack becomes empty, remove it from the map.
    // That way, the invariant that the list of keys in key_ancestors is exactly those keys for
    // which inheritable attributes are available.

    if (!inheritable_keys.empty()) {
        QTC::TC("qpdf", "QPDF opt inheritable keys");
        for (auto const& key: inheritable_keys) {
            key_ancestors[key].pop_back();
            if (key_ancestors[key].empty()) {
                QTC::TC("qpdf", "QPDF opt erase empty key ancestor");
                key_ancestors.erase(key);
            }
        }
    } else {
        QTC::TC("qpdf", "QPDF opt no inheritable keys");
    }
}